

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::AdjustReflectionAngle(AActor *this,AActor *thing,DAngle *angle)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  DAngle *max_pitch;
  DAngle *max_turn;
  DAngle *ang_offset;
  DAngle *pitch_offset;
  double dVar5;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  DAngle local_28;
  
  if (((this->flags2).Value & 1) != 0) {
    return true;
  }
  uVar1 = (thing->flags7).Value;
  if ((uVar1 >> 0xb & 1) != 0) {
    return false;
  }
  uVar2 = (thing->flags4).Value;
  if ((uVar2 >> 0x19 & 1) == 0) {
    iVar3 = FRandom::operator()(&pr_reflect);
    if ((uVar2 >> 0x1a & 1) == 0) {
      dVar5 = (double)(iVar3 % 0x10 + -8) + angle->Degrees;
      goto LAB_004288aa;
    }
  }
  else {
    if ((uVar1 >> 0x1b & 1) != 0) {
      return true;
    }
    if (45.0 < ABS((double)SUB84((angle->Degrees - (thing->Angles).Yaw.Degrees) * 11930464.711111112
                                 + 6755399441055744.0,0) * 8.381903171539307e-08)) {
      return true;
    }
    iVar3 = FRandom::operator()(&pr_reflect);
  }
  if (iVar3 < 0x80) {
    dVar5 = angle->Degrees + 45.0;
  }
  else {
    dVar5 = angle->Degrees + -45.0;
  }
LAB_004288aa:
  angle->Degrees = dVar5;
  if (((thing->flags7).Value & 0x2000) != 0) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->target);
    if (pAVar4 == (AActor *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&thing->target);
      if (pAVar4 == (AActor *)0x0) {
        return false;
      }
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&thing->target);
      max_turn = &local_48;
      local_48.Degrees = 0.0;
      max_pitch = &local_50;
      local_50.Degrees = 270.0;
      ang_offset = &local_58;
      local_58.Degrees = 0.0;
      pitch_offset = &local_60;
    }
    else {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->target);
      max_turn = &local_28;
      local_28.Degrees = 0.0;
      max_pitch = &local_30;
      local_30.Degrees = 270.0;
      ang_offset = &local_38;
      local_38.Degrees = 0.0;
      pitch_offset = &local_40;
    }
    pitch_offset->Degrees = 0.0;
    A_Face(this,pAVar4,max_turn,max_pitch,ang_offset,pitch_offset,0,0.0);
  }
  return false;
}

Assistant:

bool AActor::AdjustReflectionAngle (AActor *thing, DAngle &angle)
{
	if (flags2 & MF2_DONTREFLECT) return true;
	if (thing->flags7 & MF7_THRUREFLECT) return false;
	// Change angle for reflection
	if (thing->flags4&MF4_SHIELDREFLECT)
	{
		// Shield reflection (from the Centaur)
		if (absangle(angle, thing->Angles.Yaw) > 45)
			return true;	// Let missile explode

		if (thing->flags7 & MF7_NOSHIELDREFLECT) return true;

		if (pr_reflect () < 128)
			angle += 45;
		else
			angle -= 45;

	}
	else if (thing->flags4&MF4_DEFLECT)
	{
		// deflect (like the Heresiarch)
		if(pr_reflect() < 128) 
			angle += 45;
		else 
			angle -= 45;
	}
	else
	{
		angle += ((pr_reflect() % 16) - 8);
	}
	//Always check for AIMREFLECT, no matter what else is checked above.
	if (thing->flags7 & MF7_AIMREFLECT)
	{
		if (this->target != NULL)
		{
			A_Face(this, this->target);
		}
		else if (thing->target != NULL)
		{
			A_Face(this, thing->target);
		}
	}
	
	return false;
}